

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O3

BrailleCanvas * __thiscall plot::BrailleCanvas::push(BrailleCanvas *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  pointer pbVar3;
  pointer pbVar4;
  anon_struct_8_0_00000001_for___align aVar5;
  pointer pbVar6;
  const_iterator __j;
  _Node *p_Var7;
  _Node *p_Var8;
  _Fwd_list_node_base *__to;
  value_type local_28;
  
  p_Var7 = (_Node *)(this->available_layers_).
                    super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
                    ._M_impl._M_head._M_next;
  if (p_Var7 == (_Node *)0x0) {
    uVar1 = this->lines_;
    uVar2 = this->cols_;
    local_28.color.b = (float)(int)uVar1;
    local_28.color._0_8_ = uVar2;
    local_28.color.a = (float)((ulong)uVar1 >> 0x20);
    p_Var7 = std::
             _Fwd_list_base<plot::detail::braille::image_t,std::allocator<plot::detail::braille::image_t>>
             ::_M_create_node<plot::GenericPoint<long>>
                       ((_Fwd_list_base<plot::detail::braille::image_t,std::allocator<plot::detail::braille::image_t>>
                         *)&this->available_layers_,(GenericPoint<long> *)&local_28);
    (p_Var7->super__Fwd_list_node_base)._M_next =
         (this->available_layers_).
         super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
         ._M_impl._M_head._M_next;
    (this->available_layers_).
    super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
    ._M_impl._M_head._M_next = &p_Var7->super__Fwd_list_node_base;
  }
  p_Var8 = (_Node *)(this->stack_).
                    super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
                    ._M_impl._M_head._M_next;
  if (p_Var7 != (_Node *)&this->stack_) {
    (this->available_layers_).
    super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
    ._M_impl._M_head._M_next = (p_Var7->super__Fwd_list_node_base)._M_next;
    (p_Var7->super__Fwd_list_node_base)._M_next = (_Fwd_list_node_base *)p_Var8;
    (this->stack_).
    super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
    ._M_impl._M_head._M_next = &p_Var7->super__Fwd_list_node_base;
    p_Var8 = p_Var7;
  }
  pbVar3 = (this->blocks_).
           super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
           .
           super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar4 = *(pointer *)((long)&(p_Var8->_M_storage)._M_storage + 8);
  aVar5 = (anon_struct_8_0_00000001_for___align)
          (this->blocks_).
          super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
          .
          super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (this->blocks_).
           super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
           .
           super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->blocks_).
  super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>.
  super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(p_Var8->_M_storage)._M_storage.__align;
  (this->blocks_).
  super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>.
  super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
  (this->blocks_).
  super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>.
  super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       *(pointer *)((long)&(p_Var8->_M_storage)._M_storage + 0x10);
  (p_Var8->_M_storage)._M_storage.__align = aVar5;
  *(pointer *)((long)&(p_Var8->_M_storage)._M_storage + 8) = pbVar6;
  *(pointer *)((long)&(p_Var8->_M_storage)._M_storage + 0x10) = pbVar3;
  local_28.color = (Color)ZEXT816(0);
  local_28.pixels = '\0';
  local_28._17_3_ = 0;
  std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>::
  _M_fill_assign(&(this->blocks_).
                  super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                 ,((long)(this->blocks_).
                         super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                         .
                         super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->blocks_).
                         super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                         .
                         super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
                 &local_28);
  return this;
}

Assistant:

BrailleCanvas& push() {
        if (available_layers_.empty())
            available_layers_.emplace_front(char_size());

        stack_.splice_after(stack_.before_begin(), available_layers_, available_layers_.before_begin());
        blocks_.swap(stack_.front());
        blocks_.clear();
        return *this;
    }